

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Context.cpp
# Opt level: O0

void __thiscall Hpipe::anon_unknown_7::PcMaker::~PcMaker(PcMaker *this)

{
  PcMaker *this_local;
  
  std::pair<Hpipe::Context,_Hpipe::Vec<unsigned_int>_>::~pair(&this->res);
  return;
}

Assistant:

PcMaker( const Context *orig ) : res{ orig->flags, {} }, orig{ orig } {
        res.first.mark = orig->mark;
    }